

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined4 *puVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 *puVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  undefined8 *puVar24;
  float *pfVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  int iVar32;
  int iVar33;
  float fVar34;
  undefined4 uVar35;
  Geometry *pGVar36;
  long lVar37;
  long lVar38;
  RTCFilterFunctionN p_Var39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  undefined1 auVar44 [16];
  undefined8 uVar45;
  NodeRef *pNVar46;
  int iVar47;
  AABBNodeMB4D *node1;
  ulong uVar48;
  size_t sVar49;
  uint uVar50;
  long lVar51;
  size_t sVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  float fVar62;
  undefined1 auVar63 [16];
  float fVar64;
  float fVar70;
  float fVar72;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar65;
  float fVar71;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar69 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar81;
  float fVar85;
  float fVar86;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar87;
  float fVar88;
  uint uVar89;
  float fVar90;
  uint uVar91;
  float fVar92;
  uint uVar93;
  float fVar94;
  uint uVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  NodeRef *local_ae0;
  float fStack_ad0;
  float fStack_acc;
  undefined8 local_ac8;
  float local_aa8;
  float fStack_aa4;
  undefined1 local_a88 [16];
  undefined1 (*local_a78) [16];
  NodeRef *local_a70;
  Scene *scene;
  ulong local_a60;
  size_t local_a58;
  ulong local_a50;
  ulong local_a48;
  ulong local_a40;
  ulong local_a38;
  ulong local_a30;
  RTCFilterFunctionNArguments args;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined1 local_928 [16];
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  undefined1 local_8f8 [16];
  int local_8d8;
  int iStack_8d4;
  int iStack_8d0;
  int iStack_8cc;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  float local_8a8 [4];
  float local_898 [4];
  undefined1 local_888 [16];
  float local_878 [4];
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar26 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar27 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar28 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar29 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar30 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar31 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar56 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar53 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar61 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar54 = uVar56 ^ 0x10;
  iVar32 = (tray->tnear).field_0.i[k];
  iVar33 = (tray->tfar).field_0.i[k];
  local_a78 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  pNVar46 = stack + 1;
  local_ac8 = k;
  local_a60 = uVar56;
LAB_006f88b0:
  do {
    local_a70 = pNVar46;
    if (local_a70 == stack) {
LAB_006f9346:
      return local_a70 != stack;
    }
    local_ae0 = local_a70 + -1;
    sVar52 = local_a70[-1].ptr;
    while ((sVar52 & 8) == 0) {
      uVar48 = sVar52 & 0xfffffffffffffff0;
      fVar62 = *(float *)(ray + k * 4 + 0x70);
      pfVar25 = (float *)(uVar48 + 0x80 + uVar56);
      pfVar23 = (float *)(uVar48 + 0x20 + uVar56);
      auVar79._0_4_ = ((*pfVar25 * fVar62 + *pfVar23) - fVar26) * fVar29;
      auVar79._4_4_ = ((pfVar25[1] * fVar62 + pfVar23[1]) - fVar26) * fVar29;
      auVar79._8_4_ = ((pfVar25[2] * fVar62 + pfVar23[2]) - fVar26) * fVar29;
      auVar79._12_4_ = ((pfVar25[3] * fVar62 + pfVar23[3]) - fVar26) * fVar29;
      auVar77._4_4_ = iVar32;
      auVar77._0_4_ = iVar32;
      auVar77._8_4_ = iVar32;
      auVar77._12_4_ = iVar32;
      auVar66 = maxps(auVar77,auVar79);
      pfVar25 = (float *)(uVar48 + 0x80 + uVar53);
      pfVar23 = (float *)(uVar48 + 0x20 + uVar53);
      auVar76._0_4_ = ((*pfVar25 * fVar62 + *pfVar23) - fVar27) * fVar30;
      auVar76._4_4_ = ((pfVar25[1] * fVar62 + pfVar23[1]) - fVar27) * fVar30;
      auVar76._8_4_ = ((pfVar25[2] * fVar62 + pfVar23[2]) - fVar27) * fVar30;
      auVar76._12_4_ = ((pfVar25[3] * fVar62 + pfVar23[3]) - fVar27) * fVar30;
      pfVar25 = (float *)(uVar48 + 0x80 + uVar61);
      pfVar23 = (float *)(uVar48 + 0x20 + uVar61);
      auVar82._0_4_ = ((*pfVar25 * fVar62 + *pfVar23) - fVar28) * fVar31;
      auVar82._4_4_ = ((pfVar25[1] * fVar62 + pfVar23[1]) - fVar28) * fVar31;
      auVar82._8_4_ = ((pfVar25[2] * fVar62 + pfVar23[2]) - fVar28) * fVar31;
      auVar82._12_4_ = ((pfVar25[3] * fVar62 + pfVar23[3]) - fVar28) * fVar31;
      auVar77 = maxps(auVar76,auVar82);
      auVar77 = maxps(auVar66,auVar77);
      pfVar25 = (float *)(uVar48 + 0x80 + uVar54);
      pfVar23 = (float *)(uVar48 + 0x20 + uVar54);
      auVar83._0_4_ = ((*pfVar25 * fVar62 + *pfVar23) - fVar26) * fVar29;
      auVar83._4_4_ = ((pfVar25[1] * fVar62 + pfVar23[1]) - fVar26) * fVar29;
      auVar83._8_4_ = ((pfVar25[2] * fVar62 + pfVar23[2]) - fVar26) * fVar29;
      auVar83._12_4_ = ((pfVar25[3] * fVar62 + pfVar23[3]) - fVar26) * fVar29;
      auVar78._4_4_ = iVar33;
      auVar78._0_4_ = iVar33;
      auVar78._8_4_ = iVar33;
      auVar78._12_4_ = iVar33;
      auVar79 = minps(auVar78,auVar83);
      pfVar25 = (float *)(uVar48 + 0x80 + (uVar53 ^ 0x10));
      pfVar23 = (float *)(uVar48 + 0x20 + (uVar53 ^ 0x10));
      auVar84._0_4_ = ((*pfVar25 * fVar62 + *pfVar23) - fVar27) * fVar30;
      auVar84._4_4_ = ((pfVar25[1] * fVar62 + pfVar23[1]) - fVar27) * fVar30;
      auVar84._8_4_ = ((pfVar25[2] * fVar62 + pfVar23[2]) - fVar27) * fVar30;
      auVar84._12_4_ = ((pfVar25[3] * fVar62 + pfVar23[3]) - fVar27) * fVar30;
      pfVar25 = (float *)(uVar48 + 0x80 + (uVar61 ^ 0x10));
      pfVar23 = (float *)(uVar48 + 0x20 + (uVar61 ^ 0x10));
      auVar66._4_4_ = ((pfVar25[1] * fVar62 + pfVar23[1]) - fVar28) * fVar31;
      auVar66._0_4_ = ((*pfVar25 * fVar62 + *pfVar23) - fVar28) * fVar31;
      auVar66._8_4_ = ((pfVar25[2] * fVar62 + pfVar23[2]) - fVar28) * fVar31;
      auVar66._12_4_ = ((pfVar25[3] * fVar62 + pfVar23[3]) - fVar28) * fVar31;
      auVar66 = minps(auVar84,auVar66);
      auVar66 = minps(auVar79,auVar66);
      bVar40 = auVar77._0_4_ <= auVar66._0_4_;
      bVar41 = auVar77._4_4_ <= auVar66._4_4_;
      bVar42 = auVar77._8_4_ <= auVar66._8_4_;
      bVar43 = auVar77._12_4_ <= auVar66._12_4_;
      if (((uint)sVar52 & 7) == 6) {
        bVar40 = (fVar62 < *(float *)(uVar48 + 0xf0) && *(float *)(uVar48 + 0xe0) <= fVar62) &&
                 bVar40;
        bVar41 = (fVar62 < *(float *)(uVar48 + 0xf4) && *(float *)(uVar48 + 0xe4) <= fVar62) &&
                 bVar41;
        bVar42 = (fVar62 < *(float *)(uVar48 + 0xf8) && *(float *)(uVar48 + 0xe8) <= fVar62) &&
                 bVar42;
        bVar43 = (fVar62 < *(float *)(uVar48 + 0xfc) && *(float *)(uVar48 + 0xec) <= fVar62) &&
                 bVar43;
      }
      auVar67._0_4_ = (uint)bVar40 * -0x80000000;
      auVar67._4_4_ = (uint)bVar41 * -0x80000000;
      auVar67._8_4_ = (uint)bVar42 * -0x80000000;
      auVar67._12_4_ = (uint)bVar43 * -0x80000000;
      uVar50 = movmskps((int)root.ptr,auVar67);
      root.ptr = (size_t)uVar50;
      pNVar46 = local_ae0;
      if (uVar50 == 0) goto LAB_006f88b0;
      root.ptr = (size_t)(byte)uVar50;
      lVar51 = 0;
      if (root.ptr != 0) {
        for (; ((byte)uVar50 >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
        }
      }
      sVar52 = *(size_t *)(uVar48 + lVar51 * 8);
      uVar50 = (uVar50 & 0xff) - 1 & uVar50 & 0xff;
      uVar55 = (ulong)uVar50;
      if (uVar50 != 0) {
        do {
          root.ptr = uVar55;
          local_ae0->ptr = sVar52;
          local_ae0 = local_ae0 + 1;
          lVar51 = 0;
          if (root.ptr != 0) {
            for (; (root.ptr >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
            }
          }
          sVar52 = *(size_t *)(uVar48 + lVar51 * 8);
          uVar55 = root.ptr - 1 & root.ptr;
        } while (uVar55 != 0);
      }
    }
    local_a58 = (ulong)((uint)sVar52 & 0xf) - 8;
    uVar48 = sVar52 & 0xfffffffffffffff0;
    sVar52 = 0;
    while (sVar49 = local_ac8, pNVar46 = local_ae0, sVar52 != local_a58) {
      lVar51 = sVar52 * 0x50;
      scene = context->scene;
      pGVar36 = (scene->geometries).items[*(uint *)(uVar48 + 0x30 + lVar51)].ptr;
      fVar62 = (pGVar36->time_range).lower;
      fVar96 = ((*(float *)(ray + k * 4 + 0x70) - fVar62) / ((pGVar36->time_range).upper - fVar62))
               * pGVar36->fnumTimeSegments;
      auVar68 = roundss(ZEXT416((uint)fVar62),ZEXT416((uint)fVar96),9);
      fVar62 = pGVar36->fnumTimeSegments + -1.0;
      if (fVar62 <= auVar68._0_4_) {
        auVar68._0_4_ = fVar62;
      }
      fVar62 = 0.0;
      if (0.0 <= auVar68._0_4_) {
        fVar62 = auVar68._0_4_;
      }
      uVar60 = (ulong)*(uint *)(uVar48 + 4 + lVar51);
      lVar37 = *(long *)(*(long *)&pGVar36[2].numPrimitives + (long)(int)fVar62 * 0x38);
      lVar38 = *(long *)(*(long *)&pGVar36[2].numPrimitives + 0x38 + (long)(int)fVar62 * 0x38);
      pfVar23 = (float *)(lVar37 + (ulong)*(uint *)(uVar48 + lVar51) * 4);
      uVar56 = (ulong)*(uint *)(uVar48 + 0x10 + lVar51);
      pfVar25 = (float *)(lVar37 + uVar56 * 4);
      uVar55 = (ulong)*(uint *)(uVar48 + 0x20 + lVar51);
      puVar1 = (undefined8 *)(lVar37 + uVar55 * 4);
      uVar45 = *puVar1;
      pfVar2 = (float *)(lVar37 + uVar60 * 4);
      local_a38 = (ulong)*(uint *)(uVar48 + 0x14 + lVar51);
      pfVar3 = (float *)(lVar37 + local_a38 * 4);
      uVar57 = (ulong)*(uint *)(uVar48 + 0x24 + lVar51);
      pfVar4 = (float *)(lVar37 + uVar57 * 4);
      uVar58 = (ulong)*(uint *)(uVar48 + 8 + lVar51);
      puVar5 = (undefined4 *)(lVar37 + uVar58 * 4);
      local_a50 = (ulong)*(uint *)(uVar48 + 0x18 + lVar51);
      pfVar6 = (float *)(lVar37 + local_a50 * 4);
      local_a30 = (ulong)*(uint *)(uVar48 + 0x28 + lVar51);
      pfVar7 = (float *)(lVar37 + local_a30 * 4);
      uVar59 = (ulong)*(uint *)(uVar48 + 0xc + lVar51);
      puVar8 = (undefined4 *)(lVar37 + uVar59 * 4);
      local_a48 = (ulong)*(uint *)(uVar48 + 0x1c + lVar51);
      pfVar9 = (float *)(lVar37 + local_a48 * 4);
      uVar50 = *(uint *)(uVar48 + 0x2c + lVar51);
      local_a40 = (ulong)uVar50;
      pfVar10 = (float *)(lVar37 + local_a40 * 4);
      pfVar11 = (float *)(lVar38 + (ulong)*(uint *)(uVar48 + lVar51) * 4);
      pfVar12 = (float *)(lVar38 + uVar56 * 4);
      fVar96 = fVar96 - fVar62;
      pfVar13 = (float *)(lVar38 + uVar60 * 4);
      local_ac8 = CONCAT44(*puVar8,*puVar5);
      pfVar14 = (float *)(lVar38 + uVar58 * 4);
      local_aa8 = (float)uVar45;
      fStack_aa4 = (float)((ulong)uVar45 >> 0x20);
      pfVar15 = (float *)(lVar38 + uVar59 * 4);
      pfVar16 = (float *)(lVar38 + local_a50 * 4);
      pfVar17 = (float *)(lVar38 + local_a38 * 4);
      pfVar18 = (float *)(lVar38 + local_a48 * 4);
      pfVar19 = (float *)(lVar38 + uVar55 * 4);
      pfVar20 = (float *)(lVar38 + local_a30 * 4);
      pfVar21 = (float *)(lVar38 + uVar57 * 4);
      pfVar22 = (float *)(lVar38 + local_a40 * 4);
      fVar62 = 1.0 - fVar96;
      fVar97 = *pfVar23 * fVar62 + *pfVar11 * fVar96;
      fVar99 = *pfVar2 * fVar62 + *pfVar13 * fVar96;
      fVar101 = fStack_ad0 * fVar62 + *pfVar14 * fVar96;
      fVar103 = fStack_acc * fVar62 + *pfVar15 * fVar96;
      fVar64 = pfVar23[1] * fVar62 + pfVar11[1] * fVar96;
      fVar70 = pfVar2[1] * fVar62 + pfVar13[1] * fVar96;
      fVar72 = (float)puVar5[1] * fVar62 + pfVar14[1] * fVar96;
      fVar74 = (float)puVar8[1] * fVar62 + pfVar15[1] * fVar96;
      fVar98 = pfVar23[2] * fVar62 + pfVar11[2] * fVar96;
      fVar100 = pfVar2[2] * fVar62 + pfVar13[2] * fVar96;
      fVar102 = (float)puVar5[2] * fVar62 + pfVar14[2] * fVar96;
      fVar104 = (float)puVar8[2] * fVar62 + pfVar15[2] * fVar96;
      puVar24 = (undefined8 *)(uVar48 + 0x30 + lVar51);
      local_938 = *puVar24;
      uStack_930 = puVar24[1];
      puVar24 = (undefined8 *)(uVar48 + 0x40 + lVar51);
      local_948 = *puVar24;
      uStack_940 = puVar24[1];
      fVar81 = fVar97 - (*pfVar25 * fVar62 + *pfVar12 * fVar96);
      fVar85 = fVar99 - (*pfVar3 * fVar62 + *pfVar17 * fVar96);
      fVar86 = fVar101 - (*pfVar6 * fVar62 + *pfVar16 * fVar96);
      fVar87 = fVar103 - (*pfVar9 * fVar62 + *pfVar18 * fVar96);
      fVar114 = fVar64 - (pfVar25[1] * fVar62 + pfVar12[1] * fVar96);
      fVar116 = fVar70 - (pfVar3[1] * fVar62 + pfVar17[1] * fVar96);
      fVar118 = fVar72 - (pfVar6[1] * fVar62 + pfVar16[1] * fVar96);
      fVar120 = fVar74 - (pfVar9[1] * fVar62 + pfVar18[1] * fVar96);
      fVar122 = fVar98 - (pfVar25[2] * fVar62 + pfVar12[2] * fVar96);
      fVar123 = fVar100 - (pfVar3[2] * fVar62 + pfVar17[2] * fVar96);
      fVar124 = fVar102 - (pfVar6[2] * fVar62 + pfVar16[2] * fVar96);
      fVar125 = fVar104 - (pfVar9[2] * fVar62 + pfVar18[2] * fVar96);
      fVar65 = (local_aa8 * fVar62 + *pfVar19 * fVar96) - fVar97;
      fVar71 = (*pfVar4 * fVar62 + *pfVar21 * fVar96) - fVar99;
      fVar73 = (*pfVar7 * fVar62 + *pfVar20 * fVar96) - fVar101;
      fVar75 = (*pfVar10 * fVar62 + *pfVar22 * fVar96) - fVar103;
      fVar88 = (fStack_aa4 * fVar62 + pfVar19[1] * fVar96) - fVar64;
      fVar90 = (pfVar4[1] * fVar62 + pfVar21[1] * fVar96) - fVar70;
      fVar92 = (pfVar7[1] * fVar62 + pfVar20[1] * fVar96) - fVar72;
      fVar94 = (pfVar10[1] * fVar62 + pfVar22[1] * fVar96) - fVar74;
      fVar106 = (fVar62 * (float)puVar1[1] + fVar96 * pfVar19[2]) - fVar98;
      fVar107 = (fVar62 * pfVar4[2] + fVar96 * pfVar21[2]) - fVar100;
      fVar108 = (fVar62 * pfVar7[2] + fVar96 * pfVar20[2]) - fVar102;
      fVar109 = (fVar62 * pfVar10[2] + fVar96 * pfVar22[2]) - fVar104;
      local_898[0] = fVar122 * fVar88 - fVar114 * fVar106;
      local_898[1] = fVar123 * fVar90 - fVar116 * fVar107;
      local_898[2] = fVar124 * fVar92 - fVar118 * fVar108;
      local_898[3] = fVar125 * fVar94 - fVar120 * fVar109;
      fVar62 = *(float *)(ray + sVar49 * 4);
      fVar96 = *(float *)(ray + sVar49 * 4 + 0x10);
      fVar113 = *(float *)(ray + sVar49 * 4 + 0x40);
      fVar34 = *(float *)(ray + sVar49 * 4 + 0x50);
      fVar97 = fVar97 - fVar62;
      fVar99 = fVar99 - fVar62;
      fStack_ad0 = fVar101 - fVar62;
      fStack_acc = fVar103 - fVar62;
      fVar64 = fVar64 - fVar96;
      fVar70 = fVar70 - fVar96;
      fVar72 = fVar72 - fVar96;
      fVar74 = fVar74 - fVar96;
      fVar126 = fVar97 * fVar34 - fVar64 * fVar113;
      fVar127 = fVar99 * fVar34 - fVar70 * fVar113;
      fVar128 = fStack_ad0 * fVar34 - fVar72 * fVar113;
      fVar129 = fStack_acc * fVar34 - fVar74 * fVar113;
      local_888._0_4_ = fVar81 * fVar106 - fVar122 * fVar65;
      local_888._4_4_ = fVar85 * fVar107 - fVar123 * fVar71;
      local_888._8_4_ = fVar86 * fVar108 - fVar124 * fVar73;
      local_888._12_4_ = fVar87 * fVar109 - fVar125 * fVar75;
      fVar62 = *(float *)(ray + sVar49 * 4 + 0x20);
      fVar96 = *(float *)(ray + sVar49 * 4 + 0x60);
      fVar98 = fVar98 - fVar62;
      fVar100 = fVar100 - fVar62;
      fVar102 = fVar102 - fVar62;
      fVar104 = fVar104 - fVar62;
      fVar62 = fVar98 * fVar113 - fVar97 * fVar96;
      fVar101 = fVar100 * fVar113 - fVar99 * fVar96;
      fVar103 = fVar102 * fVar113 - fStack_ad0 * fVar96;
      fVar105 = fVar104 * fVar113 - fStack_acc * fVar96;
      local_878[0] = fVar114 * fVar65 - fVar81 * fVar88;
      local_878[1] = fVar116 * fVar71 - fVar85 * fVar90;
      local_878[2] = fVar118 * fVar73 - fVar86 * fVar92;
      local_878[3] = fVar120 * fVar75 - fVar87 * fVar94;
      fVar115 = fVar64 * fVar96 - fVar98 * fVar34;
      fVar117 = fVar70 * fVar96 - fVar100 * fVar34;
      fVar119 = fVar72 * fVar96 - fVar102 * fVar34;
      fVar121 = fVar74 * fVar96 - fVar104 * fVar34;
      fVar110 = fVar113 * local_898[0] + fVar34 * local_888._0_4_ + fVar96 * local_878[0];
      fVar111 = fVar113 * local_898[1] + fVar34 * local_888._4_4_ + fVar96 * local_878[1];
      fVar112 = fVar113 * local_898[2] + fVar34 * local_888._8_4_ + fVar96 * local_878[2];
      fVar113 = fVar113 * local_898[3] + fVar34 * local_888._12_4_ + fVar96 * local_878[3];
      uVar89 = (uint)fVar110 & 0x80000000;
      uVar91 = (uint)fVar111 & 0x80000000;
      uVar93 = (uint)fVar112 & 0x80000000;
      uVar95 = (uint)fVar113 & 0x80000000;
      local_928._0_4_ =
           (float)((uint)(fVar65 * fVar115 + fVar88 * fVar62 + fVar106 * fVar126) ^ uVar89);
      local_928._4_4_ =
           (float)((uint)(fVar71 * fVar117 + fVar90 * fVar101 + fVar107 * fVar127) ^ uVar91);
      local_928._8_4_ =
           (float)((uint)(fVar73 * fVar119 + fVar92 * fVar103 + fVar108 * fVar128) ^ uVar93);
      local_928._12_4_ =
           (float)((uint)(fVar75 * fVar121 + fVar94 * fVar105 + fVar109 * fVar129) ^ uVar95);
      local_918 = (float)((uint)(fVar115 * fVar81 + fVar62 * fVar114 + fVar126 * fVar122) ^ uVar89);
      fStack_914 = (float)((uint)(fVar117 * fVar85 + fVar101 * fVar116 + fVar127 * fVar123) ^ uVar91
                          );
      fStack_910 = (float)((uint)(fVar119 * fVar86 + fVar103 * fVar118 + fVar128 * fVar124) ^ uVar93
                          );
      fStack_90c = (float)((uint)(fVar121 * fVar87 + fVar105 * fVar120 + fVar129 * fVar125) ^ uVar95
                          );
      fVar62 = ABS(fVar110);
      fVar96 = ABS(fVar111);
      local_8f8._0_8_ = CONCAT44(fVar111,fVar110) & 0x7fffffff7fffffff;
      local_8f8._8_4_ = ABS(fVar112);
      local_8f8._12_4_ = ABS(fVar113);
      bVar41 = ((0.0 <= local_918 && 0.0 <= local_928._0_4_) && fVar110 != 0.0) &&
               local_928._0_4_ + local_918 <= fVar62;
      auVar80._0_4_ = -(uint)bVar41;
      bVar43 = ((0.0 <= fStack_914 && 0.0 <= local_928._4_4_) && fVar111 != 0.0) &&
               local_928._4_4_ + fStack_914 <= fVar96;
      auVar80._4_4_ = -(uint)bVar43;
      bVar42 = ((0.0 <= fStack_910 && 0.0 <= local_928._8_4_) && fVar112 != 0.0) &&
               local_928._8_4_ + fStack_910 <= local_8f8._8_4_;
      auVar80._8_4_ = -(uint)bVar42;
      bVar40 = ((0.0 <= fStack_90c && 0.0 <= local_928._12_4_) && fVar113 != 0.0) &&
               local_928._12_4_ + fStack_90c <= local_8f8._12_4_;
      auVar80._12_4_ = -(uint)bVar40;
      iVar47 = movmskps(uVar50,auVar80);
      if (iVar47 != 0) {
        local_908 = (float)(uVar89 ^ (uint)(fVar97 * local_898[0] +
                                           fVar64 * local_888._0_4_ + fVar98 * local_878[0]));
        fStack_904 = (float)(uVar91 ^ (uint)(fVar99 * local_898[1] +
                                            fVar70 * local_888._4_4_ + fVar100 * local_878[1]));
        fStack_900 = (float)(uVar93 ^ (uint)(fStack_ad0 * local_898[2] +
                                            fVar72 * local_888._8_4_ + fVar102 * local_878[2]));
        fStack_8fc = (float)(uVar95 ^ (uint)(fStack_acc * local_898[3] +
                                            fVar74 * local_888._12_4_ + fVar104 * local_878[3]));
        fVar113 = *(float *)(ray + sVar49 * 4 + 0x30);
        fVar34 = *(float *)(ray + sVar49 * 4 + 0x80);
        local_8d8 = -(uint)((local_908 <= fVar34 * fVar62 && fVar113 * fVar62 < local_908) && bVar41
                           );
        iStack_8d4 = -(uint)((fStack_904 <= fVar34 * fVar96 && fVar113 * fVar96 < fStack_904) &&
                            bVar43);
        iStack_8d0 = -(uint)((fStack_900 <= fVar34 * local_8f8._8_4_ &&
                             fVar113 * local_8f8._8_4_ < fStack_900) && bVar42);
        iStack_8cc = -(uint)((fStack_8fc <= fVar34 * local_8f8._12_4_ &&
                             fVar113 * local_8f8._12_4_ < fStack_8fc) && bVar40);
        auVar44._4_4_ = iStack_8d4;
        auVar44._0_4_ = local_8d8;
        auVar44._8_4_ = iStack_8d0;
        auVar44._12_4_ = iStack_8cc;
        uVar50 = movmskps(iVar47,auVar44);
        if (uVar50 != 0) {
          auVar66 = rcpps(local_888,local_8f8);
          fVar113 = auVar66._0_4_;
          fVar64 = auVar66._4_4_;
          fVar65 = auVar66._8_4_;
          fVar70 = auVar66._12_4_;
          fVar113 = (1.0 - fVar62 * fVar113) * fVar113 + fVar113;
          fVar64 = (1.0 - fVar96 * fVar64) * fVar64 + fVar64;
          fVar65 = (1.0 - local_8f8._8_4_ * fVar65) * fVar65 + fVar65;
          fVar70 = (1.0 - local_8f8._12_4_ * fVar70) * fVar70 + fVar70;
          local_8a8[0] = local_908 * fVar113;
          local_8a8[1] = fStack_904 * fVar64;
          local_8a8[2] = fStack_900 * fVar65;
          local_8a8[3] = fStack_8fc * fVar70;
          local_8c8._0_4_ = local_928._0_4_ * fVar113;
          local_8c8._4_4_ = local_928._4_4_ * fVar64;
          local_8c8._8_4_ = local_928._8_4_ * fVar65;
          local_8c8._12_4_ = local_928._12_4_ * fVar70;
          local_8b8._0_4_ = fVar113 * local_918;
          local_8b8._4_4_ = fVar64 * fStack_914;
          local_8b8._8_4_ = fVar65 * fStack_910;
          local_8b8._12_4_ = fVar70 * fStack_90c;
          uVar56 = (ulong)(uVar50 & 0xff);
          do {
            uVar55 = 0;
            if (uVar56 != 0) {
              for (; (uVar56 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
              }
            }
            local_808 = *(uint *)((long)&local_938 + uVar55 * 4);
            pGVar36 = (scene->geometries).items[local_808].ptr;
            if ((pGVar36->mask & *(uint *)(ray + sVar49 * 4 + 0x90)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar36->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_838 = *(undefined4 *)(local_8c8 + uVar55 * 4);
                fVar62 = local_8a8[uVar55 - 4];
                *(float *)(ray + sVar49 * 4 + 0x80) = local_8a8[uVar55];
                args.context = context->user;
                uVar35 = *(undefined4 *)((long)&local_948 + uVar55 * 4);
                local_818._4_4_ = uVar35;
                local_818._0_4_ = uVar35;
                local_818._8_4_ = uVar35;
                local_818._12_4_ = uVar35;
                local_828._4_4_ = fVar62;
                local_828._0_4_ = fVar62;
                local_828._8_4_ = fVar62;
                local_828._12_4_ = fVar62;
                local_868 = local_898[uVar55];
                local_858 = local_878[uVar55 - 4];
                local_848 = local_878[uVar55];
                fStack_864 = local_868;
                fStack_860 = local_868;
                fStack_85c = local_868;
                fStack_854 = local_858;
                fStack_850 = local_858;
                fStack_84c = local_858;
                fStack_844 = local_848;
                fStack_840 = local_848;
                fStack_83c = local_848;
                uStack_834 = local_838;
                uStack_830 = local_838;
                uStack_82c = local_838;
                uStack_804 = local_808;
                uStack_800 = local_808;
                uStack_7fc = local_808;
                local_7f8 = (args.context)->instID[0];
                uStack_7f4 = local_7f8;
                uStack_7f0 = local_7f8;
                uStack_7ec = local_7f8;
                local_7e8 = (args.context)->instPrimID[0];
                uStack_7e4 = local_7e8;
                uStack_7e0 = local_7e8;
                uStack_7dc = local_7e8;
                local_a88 = *local_a78;
                args.valid = (int *)local_a88;
                args.geometryUserPtr = pGVar36->userPtr;
                args.hit = (RTCHitN *)&local_868;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar36->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar36->occlusionFilterN)(&args);
                }
                if (local_a88 == (undefined1  [16])0x0) {
                  auVar69._8_4_ = 0xffffffff;
                  auVar69._0_8_ = 0xffffffffffffffff;
                  auVar69._12_4_ = 0xffffffff;
                  auVar69 = auVar69 ^ _DAT_01f46b70;
                }
                else {
                  p_Var39 = context->args->filter;
                  if ((p_Var39 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar36->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var39)(&args);
                  }
                  auVar63._0_4_ = -(uint)(local_a88._0_4_ == 0);
                  auVar63._4_4_ = -(uint)(local_a88._4_4_ == 0);
                  auVar63._8_4_ = -(uint)(local_a88._8_4_ == 0);
                  auVar63._12_4_ = -(uint)(local_a88._12_4_ == 0);
                  auVar69 = auVar63 ^ _DAT_01f46b70;
                  auVar66 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar63);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar66;
                }
                sVar49 = local_ac8;
                if ((_DAT_01f46b40 & auVar69) == (undefined1  [16])0x0) {
                  *(float *)(ray + local_ac8 * 4 + 0x80) = fVar34;
                  fStack_ad0 = 0.0;
                  fStack_acc = 0.0;
                  goto LAB_006f92c5;
                }
              }
              *(undefined4 *)(ray + sVar49 * 4 + 0x80) = 0xff800000;
              goto LAB_006f9346;
            }
LAB_006f92c5:
            uVar56 = uVar56 ^ 1L << (uVar55 & 0x3f);
          } while (uVar56 != 0);
        }
      }
      sVar52 = sVar52 + 1;
      k = sVar49;
      root.ptr = sVar52;
      uVar56 = local_a60;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }